

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashMap.h
# Opt level: O1

void __thiscall
btHashMap<btHashString,_btCollisionObject_*>::insert
          (btHashMap<btHashString,_btCollisionObject_*> *this,btHashString *key,
          btCollisionObject **value)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  btCollisionObject **ptr;
  btHashString *ptr_00;
  int *piVar6;
  undefined8 uVar7;
  uint uVar8;
  undefined4 uVar9;
  int iVar10;
  btCollisionObject **ppbVar11;
  long lVar12;
  btHashString *pbVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  
  uVar15 = key->m_hash;
  iVar3 = (this->m_valueArray).m_capacity;
  iVar10 = findIndex(this,key);
  if (iVar10 == -1) {
    iVar10 = (this->m_valueArray).m_size;
    iVar4 = (this->m_valueArray).m_capacity;
    if (iVar10 == iVar4) {
      iVar17 = 1;
      if (iVar10 != 0) {
        iVar17 = iVar10 * 2;
      }
      if (iVar4 < iVar17) {
        if (iVar17 == 0) {
          ppbVar11 = (btCollisionObject **)0x0;
        }
        else {
          ppbVar11 = (btCollisionObject **)btAlignedAllocInternal((long)iVar17 << 3,0x10);
        }
        lVar12 = (long)(this->m_valueArray).m_size;
        if (0 < lVar12) {
          lVar14 = 0;
          do {
            ppbVar11[lVar14] = (this->m_valueArray).m_data[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar12 != lVar14);
        }
        ptr = (this->m_valueArray).m_data;
        if (ptr != (btCollisionObject **)0x0) {
          if ((this->m_valueArray).m_ownsMemory == true) {
            btAlignedFreeInternal(ptr);
          }
          (this->m_valueArray).m_data = (btCollisionObject **)0x0;
        }
        (this->m_valueArray).m_ownsMemory = true;
        (this->m_valueArray).m_data = ppbVar11;
        (this->m_valueArray).m_capacity = iVar17;
      }
    }
    iVar17 = (this->m_valueArray).m_size;
    (this->m_valueArray).m_data[iVar17] = *value;
    (this->m_valueArray).m_size = iVar17 + 1;
    iVar17 = (this->m_keyArray).m_size;
    iVar5 = (this->m_keyArray).m_capacity;
    if (iVar17 == iVar5) {
      iVar16 = 1;
      if (iVar17 != 0) {
        iVar16 = iVar17 * 2;
      }
      if (iVar5 < iVar16) {
        if (iVar16 == 0) {
          pbVar13 = (btHashString *)0x0;
        }
        else {
          pbVar13 = (btHashString *)btAlignedAllocInternal((long)iVar16 << 4,0x10);
        }
        lVar12 = (long)(this->m_keyArray).m_size;
        if (0 < lVar12) {
          lVar14 = 0;
          do {
            puVar1 = (undefined8 *)((long)&((this->m_keyArray).m_data)->m_string + lVar14);
            uVar7 = puVar1[1];
            puVar2 = (undefined8 *)((long)&pbVar13->m_string + lVar14);
            *puVar2 = *puVar1;
            puVar2[1] = uVar7;
            lVar14 = lVar14 + 0x10;
          } while (lVar12 * 0x10 != lVar14);
        }
        ptr_00 = (this->m_keyArray).m_data;
        if (ptr_00 != (btHashString *)0x0) {
          if ((this->m_keyArray).m_ownsMemory == true) {
            btAlignedFreeInternal(ptr_00);
          }
          (this->m_keyArray).m_data = (btHashString *)0x0;
        }
        (this->m_keyArray).m_ownsMemory = true;
        (this->m_keyArray).m_data = pbVar13;
        (this->m_keyArray).m_capacity = iVar16;
      }
    }
    uVar8 = key->m_hash;
    uVar9 = *(undefined4 *)&key->field_0xc;
    pbVar13 = (this->m_keyArray).m_data + (this->m_keyArray).m_size;
    pbVar13->m_string = key->m_string;
    pbVar13->m_hash = uVar8;
    *(undefined4 *)&pbVar13->field_0xc = uVar9;
    piVar6 = &(this->m_keyArray).m_size;
    *piVar6 = *piVar6 + 1;
    if (iVar4 < (this->m_valueArray).m_capacity) {
      growTables(this,key);
      uVar15 = (this->m_valueArray).m_capacity - 1U & key->m_hash;
    }
    else {
      uVar15 = iVar3 - 1U & uVar15;
    }
    piVar6 = (this->m_hashTable).m_data;
    (this->m_next).m_data[iVar10] = piVar6[(int)uVar15];
    piVar6[(int)uVar15] = iVar10;
  }
  else {
    (this->m_valueArray).m_data[iVar10] = *value;
  }
  return;
}

Assistant:

void insert(const Key& key, const Value& value) {
		int hash = key.getHash() & (m_valueArray.capacity()-1);

		//replace value if the key is already there
		int index = findIndex(key);
		if (index != BT_HASH_NULL)
		{
			m_valueArray[index]=value;
			return;
		}

		int count = m_valueArray.size();
		int oldCapacity = m_valueArray.capacity();
		m_valueArray.push_back(value);
		m_keyArray.push_back(key);

		int newCapacity = m_valueArray.capacity();
		if (oldCapacity < newCapacity)
		{
			growTables(key);
			//hash with new capacity
			hash = key.getHash() & (m_valueArray.capacity()-1);
		}
		m_next[count] = m_hashTable[hash];
		m_hashTable[hash] = count;
	}